

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O1

void __thiscall xray_re::xr_bone::~xr_bone(xr_bone *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppxVar3;
  
  this->_vptr_xr_bone = (_func_int **)&PTR__xr_bone_0024a4a8;
  pcVar2 = (this->m_gamemtl)._M_dataplus._M_p;
  paVar1 = &(this->m_gamemtl).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_vmap_name)._M_dataplus._M_p;
  paVar1 = &(this->m_vmap_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_parent_name)._M_dataplus._M_p;
  paVar1 = &(this->m_parent_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  paVar1 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppxVar3 = (this->m_children).
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppxVar3 != (pointer)0x0) {
    operator_delete(ppxVar3,(long)(this->m_children).
                                  super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar3
                   );
    return;
  }
  return;
}

Assistant:

void xr_bone::load_1(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(BONE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == BONE_VERSION_1 || version == BONE_VERSION);

	if (!r.find_chunk(BONE_CHUNK_DEF))
		xr_not_expected();
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	r.r_sz(m_vmap_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_BIND_POSE))
		xr_not_expected();
	r.r_fvector3(m_bind_offset);
	r.r_fvector3(m_bind_rotate);
	m_bind_length = r.r_float();
	r.debug_find_chunk();
	if (version == BONE_VERSION_1)
		std::swap(m_bind_offset.x, m_bind_offset.y);

	load_data(r);
}